

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem_unix.c
# Opt level: O3

w_status w_vmem_commit(w_vmem *mem,void *addr,size_t size)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  w_status wVar4;
  wp_vmem_trace_data *trace_data;
  long *local_30;
  
  iVar1 = w_mtx_lock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-8);
  }
  wp_trace_pool_find_data
            (&local_30,wp_vmem_tracer_inst.idx_pool,wp_vmem_tracer_inst.data_pool,0x400,8,mem);
  iVar1 = w_mtx_unlock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-0xc);
  }
  pvVar2 = mem->addr;
  if (addr < pvVar2) {
    w_handle_failed_assertion
              ("(uintptr_t)addr >= (uintptr_t)mem->addr","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xac);
    pvVar2 = mem->addr;
  }
  if ((ulong)(*local_30 + (long)pvVar2) < (long)addr + size) {
    w_handle_failed_assertion
              ("(uintptr_t)addr + size <= (uintptr_t)mem->addr + trace_data->size","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xaf);
    pvVar2 = mem->addr;
  }
  if (pvVar2 == (void *)0x0) {
    w_handle_failed_assertion
              ("mem->addr != NULL","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb4);
  }
  if (addr == (void *)0x0) {
    w_handle_failed_assertion
              ("addr != NULL","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb5);
  }
  if (size == 0) {
    w_handle_failed_assertion
              ("size > 0","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb6);
  }
  if (w_get_alloc_granularity::granularity == 0) {
    w_get_alloc_granularity::granularity = sysconf(0x1e);
  }
  if (size % w_get_alloc_granularity::granularity != 0) {
    w_handle_failed_assertion
              ("size % w_get_commit_granularity() == 0","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb7);
  }
  iVar1 = mprotect(addr,size,3);
  if (iVar1 == 0) {
    iVar1 = madvise(addr,size,3);
    if (iVar1 == 0) {
      wVar4 = W_SUCCESS;
    }
    else {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      wVar4 = W_SUCCESS;
      wp_log(W_LOG_LVL_WARNING,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,200,"failed to advise %zu bytes of virtual memory at %p\n",size,addr);
      wp_log_system_error(W_LOG_LVL_ALL,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                          ,0xc9,iVar1);
    }
  }
  else {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    wp_log(W_LOG_LVL_ERROR,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
           ,0xbe,"failed to commit %zu bytes of virtual memory at %p\n",size,addr);
    wp_log_system_error(W_LOG_LVL_ALL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                        ,0xbf,iVar1);
    wVar4 = W_ERROR_ALLOC_FAILED;
  }
  return wVar4;
}

Assistant:

enum w_status
w_vmem_commit(
    struct w_vmem *mem,
    void *addr,
    size_t size
)
{
#if W_TRACING(ENABLED)
    {
        struct wp_vmem_trace_data *trace_data;

        W_TRACER_FIND_DATA(wp_vmem_tracer, &trace_data, mem);
        W_ASSERT(
            (uintptr_t)addr >= (uintptr_t)mem->addr
        );
        W_ASSERT(
            (uintptr_t)addr + size <= (uintptr_t)mem->addr + trace_data->size
        );
    }
#endif

    W_ASSERT(mem != NULL);
    W_ASSERT(mem->addr != NULL);
    W_ASSERT(addr != NULL);
    W_ASSERT(size > 0);
    W_ASSERT(size % w_get_commit_granularity() == 0);

    if (mprotect(addr, size, PROT_READ | PROT_WRITE) != 0)
    {
        int error;

        error = errno;
        W_LOG_ERROR(WP_VMEM_GET_ERROR_MSG("commit"), size, addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
        return W_ERROR_ALLOC_FAILED;
    }

    if (madvise(addr, size, MADV_WILLNEED) != 0)
    {
        int error;

        error = errno;
        W_LOG_WARNING(WP_VMEM_GET_ERROR_MSG("advise"), size, addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
    }

    return W_SUCCESS;
}